

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph.c
# Opt level: O2

void mpr_clear_neighbor_graph(neighbor_graph *graph)

{
  mpr_clear_addr_set(&graph->set_n);
  mpr_clear_addr_set(&graph->set_n2);
  mpr_clear_n1_set(&graph->set_n1);
  mpr_clear_n1_set(&graph->set_mpr);
  mpr_clear_n1_set(&graph->set_mpr_candidates);
  free(graph->d_x_y_cache);
  graph->d_x_y_cache = (uint32_t *)0x0;
  return;
}

Assistant:

void
mpr_clear_neighbor_graph(struct neighbor_graph *graph) {
  mpr_clear_addr_set(&graph->set_n);
  mpr_clear_addr_set(&graph->set_n2);
  mpr_clear_n1_set(&graph->set_n1);
  mpr_clear_n1_set(&graph->set_mpr);
  mpr_clear_n1_set(&graph->set_mpr_candidates);

  free(graph->d_x_y_cache);
  graph->d_x_y_cache = NULL;
}